

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDnaSequence.cpp
# Opt level: O2

void __thiscall NamedDnaSequence::append(NamedDnaSequence *this,string *s)

{
  byte *pbVar1;
  ulong uVar2;
  uchar uVar3;
  undefined8 in_RAX;
  char *pcVar4;
  char *pcVar5;
  undefined8 uStack_38;
  
  pcVar4 = (s->_M_dataplus)._M_p;
  uStack_38 = in_RAX;
  for (pcVar5 = pcVar4; pcVar5 != pcVar4 + s->_M_string_length; pcVar5 = pcVar5 + 1) {
    uVar2 = this->length;
    if ((uVar2 & 1) == 0) {
      uVar3 = encode(this,*pcVar5);
      uStack_38 = CONCAT17(uVar3,(undefined7)uStack_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&this->sequence,(uchar *)((long)&uStack_38 + 7));
    }
    else {
      uVar3 = encode(this,*pcVar5);
      pbVar1 = (this->sequence).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + (uVar2 >> 1);
      *pbVar1 = *pbVar1 | uVar3 << 4;
    }
    this->length = this->length + 1;
    pcVar4 = (s->_M_dataplus)._M_p;
  }
  return;
}

Assistant:

void NamedDnaSequence::append(const string& s) {
	string::const_iterator it = s.begin();
	for (;it!=s.end(); ++it) {
		if (length % 2 == 0) {
			sequence.push_back(encode(*it));
		} else {
			sequence[length/2] |= encode(*it)<<4;
		}
		length += 1;
	}
}